

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O1

int VP8ParseIntraModeRow(VP8BitReader *br,VP8Decoder *dec)

{
  uint8_t *puVar1;
  VP8MBData *pVVar2;
  ulong *puVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  uint8_t *puVar7;
  byte bVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  range_t rVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint8_t uVar18;
  uint uVar19;
  ulong uVar20;
  
  if (0 < dec->mb_w) {
    puVar1 = dec->intra_l;
    lVar9 = 0;
    do {
      piVar6 = (int *)(dec->intra_t + lVar9 * 4);
      pVVar2 = dec->mb_data;
      if ((dec->segment_hdr).update_map == 0) {
        bVar10 = 0;
      }
      else {
        bVar10 = (dec->proba).segments[0];
        rVar14 = br->range;
        if (br->bits < 0) {
          puVar3 = (ulong *)br->buf;
          if (puVar3 < br->buf_max) {
            uVar20 = *puVar3;
            br->buf = (uint8_t *)((long)puVar3 + 7);
            br->value = br->value << 0x38 |
                        ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                         (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                         (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                        >> 8;
            br->bits = br->bits + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
          }
        }
        uVar19 = bVar10 * rVar14 >> 8;
        bVar10 = (byte)br->bits;
        uVar11 = (uint)(br->value >> (bVar10 & 0x3f));
        if (uVar19 < uVar11) {
          uVar13 = rVar14 - uVar19;
          br->value = br->value - ((ulong)uVar19 + 1 << (bVar10 & 0x3f));
        }
        else {
          uVar13 = uVar19 + 1;
        }
        uVar16 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        iVar5 = br->bits - (uVar16 ^ 7);
        rVar14 = (uVar13 << ((byte)(uVar16 ^ 7) & 0x1f)) - 1;
        br->bits = iVar5;
        br->range = rVar14;
        if (uVar19 < uVar11) {
          bVar10 = (dec->proba).segments[2];
          if (iVar5 < 0) {
            puVar3 = (ulong *)br->buf;
            if (puVar3 < br->buf_max) {
              uVar20 = *puVar3;
              br->buf = (uint8_t *)((long)puVar3 + 7);
              br->value = br->value << 0x38 |
                          ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                           (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                           (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                          >> 8;
              br->bits = iVar5 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
            }
          }
          uVar19 = bVar10 * rVar14 >> 8;
          bVar10 = (byte)br->bits;
          uVar11 = (uint)(br->value >> (bVar10 & 0x3f));
          if (uVar19 < uVar11) {
            uVar13 = rVar14 - uVar19;
            br->value = br->value - ((ulong)uVar19 + 1 << (bVar10 & 0x3f));
          }
          else {
            uVar13 = uVar19 + 1;
          }
          uVar16 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          br->bits = br->bits - (uVar16 ^ 7);
          br->range = (uVar13 << ((byte)(uVar16 ^ 7) & 0x1f)) - 1;
          bVar10 = uVar19 < uVar11 | 2;
        }
        else {
          bVar10 = (dec->proba).segments[1];
          if (iVar5 < 0) {
            puVar3 = (ulong *)br->buf;
            if (puVar3 < br->buf_max) {
              uVar20 = *puVar3;
              br->buf = (uint8_t *)((long)puVar3 + 7);
              br->value = br->value << 0x38 |
                          ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                           (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                           (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                          >> 8;
              br->bits = iVar5 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
            }
          }
          uVar19 = bVar10 * rVar14 >> 8;
          bVar10 = (byte)br->bits;
          uVar11 = (uint)(br->value >> (bVar10 & 0x3f));
          if (uVar19 < uVar11) {
            uVar13 = rVar14 - uVar19;
            br->value = br->value - ((ulong)uVar19 + 1 << (bVar10 & 0x3f));
          }
          else {
            uVar13 = uVar19 + 1;
          }
          bVar10 = uVar19 < uVar11;
          uVar11 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          br->bits = br->bits - (uVar11 ^ 7);
          br->range = (uVar13 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
        }
      }
      pVVar2[lVar9].segment = bVar10;
      if (dec->use_skip_proba != 0) {
        bVar10 = dec->skip_p;
        rVar14 = br->range;
        if (br->bits < 0) {
          puVar3 = (ulong *)br->buf;
          if (puVar3 < br->buf_max) {
            uVar20 = *puVar3;
            br->buf = (uint8_t *)((long)puVar3 + 7);
            br->value = br->value << 0x38 |
                        ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                         (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                         (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                        >> 8;
            br->bits = br->bits + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
          }
        }
        uVar19 = bVar10 * rVar14 >> 8;
        bVar10 = (byte)br->bits;
        uVar11 = (uint)(br->value >> (bVar10 & 0x3f));
        if (uVar19 < uVar11) {
          uVar13 = rVar14 - uVar19;
          br->value = br->value - ((ulong)uVar19 + 1 << (bVar10 & 0x3f));
        }
        else {
          uVar13 = uVar19 + 1;
        }
        uVar16 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        br->bits = br->bits - (uVar16 ^ 7);
        br->range = (uVar13 << ((byte)(uVar16 ^ 7) & 0x1f)) - 1;
        pVVar2[lVar9].skip = uVar19 < uVar11;
      }
      rVar14 = br->range;
      if (br->bits < 0) {
        puVar3 = (ulong *)br->buf;
        if (puVar3 < br->buf_max) {
          uVar20 = *puVar3;
          br->buf = (uint8_t *)((long)puVar3 + 7);
          br->value = br->value << 0x38 |
                      ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                       (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                       (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38) >>
                      8;
          br->bits = br->bits + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar11 = rVar14 * 0x91 >> 8;
      bVar10 = (byte)br->bits;
      uVar19 = (uint)(br->value >> (bVar10 & 0x3f));
      if (uVar11 < uVar19) {
        uVar13 = rVar14 - uVar11;
        br->value = br->value - ((ulong)uVar11 + 1 << (bVar10 & 0x3f));
      }
      else {
        uVar13 = uVar11 + 1;
      }
      uVar16 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      iVar5 = br->bits - (uVar16 ^ 7);
      rVar14 = (uVar13 << ((byte)(uVar16 ^ 7) & 0x1f)) - 1;
      br->bits = iVar5;
      br->range = rVar14;
      pVVar2[lVar9].is_i4x4 = uVar11 >= uVar19;
      if (uVar11 < uVar19) {
        if (iVar5 < 0) {
          puVar3 = (ulong *)br->buf;
          if (puVar3 < br->buf_max) {
            uVar20 = *puVar3;
            br->buf = (uint8_t *)((long)puVar3 + 7);
            br->value = br->value << 0x38 |
                        ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                         (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                         (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                        >> 8;
            br->bits = iVar5 + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
          }
        }
        uVar11 = rVar14 * 0x9c >> 8;
        bVar10 = (byte)br->bits;
        uVar19 = (uint)(br->value >> (bVar10 & 0x3f));
        if (uVar11 < uVar19) {
          uVar13 = rVar14 - uVar11;
          br->value = br->value - ((ulong)uVar11 + 1 << (bVar10 & 0x3f));
        }
        else {
          uVar13 = uVar11 + 1;
        }
        uVar16 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        iVar5 = br->bits - (uVar16 ^ 7);
        uVar13 = (uVar13 << ((byte)(uVar16 ^ 7) & 0x1f)) - 1;
        br->bits = iVar5;
        br->range = uVar13;
        if (uVar11 < uVar19) {
          if (iVar5 < 0) {
            puVar3 = (ulong *)br->buf;
            if (puVar3 < br->buf_max) {
              uVar20 = *puVar3;
              br->buf = (uint8_t *)((long)puVar3 + 7);
              br->value = br->value << 0x38 |
                          ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                           (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                           (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                          >> 8;
              br->bits = iVar5 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
            }
          }
          iVar5 = br->bits;
          uVar11 = uVar13 >> 1 & 0xffffff;
          if (uVar11 < (uint)(br->value >> ((byte)iVar5 & 0x3f))) {
            uVar13 = uVar13 - uVar11;
            br->value = br->value - ((ulong)uVar11 + 1 << ((byte)iVar5 & 0x3f));
            bVar10 = 1;
          }
          else {
            bVar10 = 3;
LAB_0013b884:
            uVar13 = uVar11 + 1;
          }
        }
        else {
          if (iVar5 < 0) {
            puVar3 = (ulong *)br->buf;
            if (puVar3 < br->buf_max) {
              uVar20 = *puVar3;
              br->buf = (uint8_t *)((long)puVar3 + 7);
              br->value = br->value << 0x38 |
                          ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                           (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                           (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                          >> 8;
              br->bits = iVar5 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
            }
          }
          iVar5 = br->bits;
          uVar11 = uVar13 * 0xa3 >> 8;
          if ((uint)(br->value >> ((byte)iVar5 & 0x3f)) <= uVar11) {
            bVar10 = 0;
            goto LAB_0013b884;
          }
          uVar13 = uVar13 - uVar11;
          br->value = br->value - ((ulong)uVar11 + 1 << ((byte)iVar5 & 0x3f));
          bVar10 = 2;
        }
        uVar11 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
          }
        }
        br->bits = iVar5 - (uVar11 ^ 7);
        br->range = (uVar13 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
        pVVar2[lVar9].imodes[0] = bVar10;
        *piVar6 = (uint)bVar10 * 0x1010101;
        *(uint *)puVar1 = (uint)bVar10 * 0x1010101;
      }
      else {
        puVar7 = pVVar2[lVar9].imodes;
        lVar12 = 0;
        do {
          uVar20 = (ulong)puVar1[lVar12];
          lVar17 = 0;
          do {
            bVar10 = *(byte *)((long)piVar6 + lVar17);
            bVar8 = kBModesProba[bVar10][uVar20][0];
            rVar14 = br->range;
            if (br->bits < 0) {
              puVar3 = (ulong *)br->buf;
              if (puVar3 < br->buf_max) {
                uVar15 = *puVar3;
                br->buf = (uint8_t *)((long)puVar3 + 7);
                br->value = br->value << 0x38 |
                            ((uVar15 & 0xff000000000000) >> 0x28 | (uVar15 & 0xff0000000000) >> 0x18
                             | (uVar15 & 0xff00000000) >> 8 | (uVar15 & 0xff000000) << 8 |
                             (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 |
                            uVar15 << 0x38) >> 8;
                br->bits = br->bits + 0x38;
              }
              else {
                VP8LoadFinalBytes(br);
              }
            }
            uVar19 = bVar8 * rVar14 >> 8;
            bVar8 = (byte)br->bits;
            uVar11 = (uint)(br->value >> (bVar8 & 0x3f));
            if (uVar19 < uVar11) {
              uVar13 = rVar14 - uVar19;
              br->value = br->value - ((ulong)uVar19 + 1 << (bVar8 & 0x3f));
            }
            else {
              uVar13 = uVar19 + 1;
            }
            uVar16 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            br->bits = br->bits - (uVar16 ^ 7);
            br->range = (uVar13 << ((byte)(uVar16 ^ 7) & 0x1f)) - 1;
            uVar13 = (uint)""[uVar19 < uVar11];
            if ((2U >> (uVar19 < uVar11) & 1) != 0) {
              do {
                bVar8 = kBModesProba[bVar10][uVar20][uVar13];
                rVar14 = br->range;
                if (br->bits < 0) {
                  puVar3 = (ulong *)br->buf;
                  if (puVar3 < br->buf_max) {
                    uVar15 = *puVar3;
                    br->buf = (uint8_t *)((long)puVar3 + 7);
                    br->value = br->value << 0x38 |
                                ((uVar15 & 0xff000000000000) >> 0x28 |
                                 (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                                 (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                                 (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38) >> 8;
                    br->bits = br->bits + 0x38;
                  }
                  else {
                    VP8LoadFinalBytes(br);
                  }
                }
                uVar19 = bVar8 * rVar14 >> 8;
                bVar8 = (byte)br->bits;
                uVar11 = (uint)(br->value >> (bVar8 & 0x3f));
                if (uVar19 < uVar11) {
                  uVar16 = rVar14 - uVar19;
                  br->value = br->value - ((ulong)uVar19 + 1 << (bVar8 & 0x3f));
                }
                else {
                  uVar16 = uVar19 + 1;
                }
                uVar4 = uVar13 * 2;
                uVar15 = (ulong)(uVar19 < uVar11);
                uVar11 = 0x1f;
                if (uVar16 != 0) {
                  for (; uVar16 >> uVar11 == 0; uVar11 = uVar11 - 1) {
                  }
                }
                br->bits = br->bits - (uVar11 ^ 7);
                br->range = (uVar16 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
                uVar13 = (uint)""[uVar15 | uVar4];
              } while ((0xa2eaUL >> (uVar15 | (ulong)uVar4 & 0x3f) & 1) != 0);
            }
            uVar20 = (ulong)-uVar13;
            uVar18 = (uint8_t)-uVar13;
            *(uint8_t *)((long)piVar6 + lVar17) = uVar18;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          *(int *)puVar7 = *piVar6;
          puVar7 = puVar7 + 4;
          puVar1[lVar12] = uVar18;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
      }
      rVar14 = br->range;
      if (br->bits < 0) {
        puVar3 = (ulong *)br->buf;
        if (puVar3 < br->buf_max) {
          uVar20 = *puVar3;
          br->buf = (uint8_t *)((long)puVar3 + 7);
          br->value = br->value << 0x38 |
                      ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                       (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                       (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38) >>
                      8;
          br->bits = br->bits + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
        }
      }
      uVar11 = rVar14 * 0x8e >> 8;
      bVar10 = (byte)br->bits;
      uVar19 = (uint)(br->value >> (bVar10 & 0x3f));
      if (uVar11 < uVar19) {
        uVar13 = rVar14 - uVar11;
        br->value = br->value - ((ulong)uVar11 + 1 << (bVar10 & 0x3f));
      }
      else {
        uVar13 = uVar11 + 1;
      }
      uVar16 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      iVar5 = br->bits - (uVar16 ^ 7);
      rVar14 = (uVar13 << ((byte)(uVar16 ^ 7) & 0x1f)) - 1;
      br->bits = iVar5;
      br->range = rVar14;
      if (uVar11 < uVar19) {
        if (iVar5 < 0) {
          puVar3 = (ulong *)br->buf;
          if (puVar3 < br->buf_max) {
            uVar20 = *puVar3;
            br->buf = (uint8_t *)((long)puVar3 + 7);
            br->value = br->value << 0x38 |
                        ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                         (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                         (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                        >> 8;
            br->bits = iVar5 + 0x38;
          }
          else {
            VP8LoadFinalBytes(br);
          }
        }
        uVar11 = rVar14 * 0x72 >> 8;
        bVar10 = (byte)br->bits;
        uVar19 = (uint)(br->value >> (bVar10 & 0x3f));
        if (uVar11 < uVar19) {
          uVar13 = rVar14 - uVar11;
          br->value = br->value - ((ulong)uVar11 + 1 << (bVar10 & 0x3f));
        }
        else {
          uVar13 = uVar11 + 1;
        }
        uVar16 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        iVar5 = br->bits - (uVar16 ^ 7);
        rVar14 = (uVar13 << ((byte)(uVar16 ^ 7) & 0x1f)) - 1;
        br->bits = iVar5;
        br->range = rVar14;
        uVar18 = '\x02';
        if (uVar11 < uVar19) {
          if (iVar5 < 0) {
            puVar3 = (ulong *)br->buf;
            if (puVar3 < br->buf_max) {
              uVar20 = *puVar3;
              br->buf = (uint8_t *)((long)puVar3 + 7);
              br->value = br->value << 0x38 |
                          ((uVar20 & 0xff000000000000) >> 0x28 | (uVar20 & 0xff0000000000) >> 0x18 |
                           (uVar20 & 0xff00000000) >> 8 | (uVar20 & 0xff000000) << 8 |
                           (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38)
                          >> 8;
              br->bits = iVar5 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
            }
          }
          uVar11 = rVar14 * 0xb7 >> 8;
          bVar10 = (byte)br->bits;
          if (uVar11 < (uint)(br->value >> (bVar10 & 0x3f))) {
            uVar19 = rVar14 - uVar11;
            br->value = br->value - ((ulong)uVar11 + 1 << (bVar10 & 0x3f));
            uVar18 = '\x01';
          }
          else {
            uVar19 = uVar11 + 1;
            uVar18 = '\x03';
          }
          uVar11 = 0x1f;
          if (uVar19 != 0) {
            for (; uVar19 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          br->bits = br->bits - (uVar11 ^ 7);
          br->range = (uVar19 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
        }
      }
      else {
        uVar18 = '\0';
      }
      pVVar2[lVar9].uvmode = uVar18;
      lVar9 = lVar9 + 1;
    } while (lVar9 < dec->mb_w);
  }
  return (int)((dec->br).eof == 0);
}

Assistant:

int VP8ParseIntraModeRow(VP8BitReader* const br, VP8Decoder* const dec) {
  int mb_x;
  for (mb_x = 0; mb_x < dec->mb_w; ++mb_x) {
    ParseIntraMode(br, dec, mb_x);
  }
  return !dec->br.eof;
}